

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O0

void __thiscall
lunasvg::SVGLayoutState::SVGLayoutState
          (SVGLayoutState *this,SVGLayoutState *parent,SVGElement *element)

{
  string_view input_00;
  LineCap LVar1;
  LineJoin LVar2;
  FillRule FVar3;
  FontWeight FVar4;
  FontStyle FVar5;
  DominantBaseline DVar6;
  TextAnchor TVar7;
  WhiteSpace WVar8;
  Direction DVar9;
  Visibility VVar10;
  bool bVar11;
  PropertyID PVar12;
  AlignmentBaseline AVar13;
  Display DVar14;
  Overflow OVar15;
  MaskType MVar16;
  int iVar17;
  Paint *pPVar18;
  Color *pCVar19;
  Length *pLVar20;
  LengthList *__x;
  string *psVar21;
  AttributeList *this_00;
  Length LVar22;
  Color *in_R8;
  Color *in_R9;
  float fVar23;
  undefined1 auVar24 [16];
  string_view input_01;
  string_view input_02;
  string_view input_03;
  string_view input_04;
  string_view input_05;
  string_view input_06;
  string_view input_07;
  string_view input_08;
  string_view input_09;
  string_view input_10;
  string_view input_11;
  string_view input_12;
  string_view input_13;
  string_view input_14;
  string_view input_15;
  BaselineShift BVar25;
  string local_2c8;
  lunasvg *local_2a8;
  size_t sStack_2a0;
  string local_298;
  lunasvg *local_278;
  size_t sStack_270;
  string local_268;
  lunasvg *local_248;
  size_t sStack_240;
  string local_238;
  lunasvg *local_218;
  size_t sStack_210;
  string local_208;
  lunasvg *local_1e8;
  size_t sStack_1e0;
  LengthList local_1d0;
  Length local_1b8;
  float local_1b0;
  LengthUnits local_1ac;
  Length local_1a8;
  float local_1a0;
  LengthUnits local_19c;
  undefined8 local_198;
  undefined4 local_190;
  undefined8 local_184;
  undefined4 local_17c;
  lunasvg *local_178;
  size_t sStack_170;
  lunasvg *local_168;
  size_t sStack_160;
  lunasvg *local_158;
  size_t sStack_150;
  lunasvg *local_148;
  size_t sStack_140;
  lunasvg *local_138;
  size_t sStack_130;
  lunasvg *local_128;
  size_t sStack_120;
  lunasvg *local_118;
  size_t sStack_110;
  uint32_t local_fc;
  lunasvg *local_f8;
  size_t sStack_f0;
  uint32_t local_dc;
  lunasvg *local_d8;
  size_t sStack_d0;
  Paint local_c0;
  lunasvg *local_98;
  size_t sStack_90;
  Paint local_88;
  undefined1 auStack_60 [8];
  string_view input;
  Attribute *attribute;
  const_iterator __end1;
  const_iterator __begin1;
  AttributeList *__range1;
  SVGElement *element_local;
  SVGLayoutState *parent_local;
  SVGLayoutState *this_local;
  
  this->m_parent = parent;
  this->m_element = element;
  pPVar18 = fill(parent);
  Paint::Paint(&this->m_fill,pPVar18);
  pPVar18 = stroke(parent);
  Paint::Paint(&this->m_stroke,pPVar18);
  pCVar19 = color(parent);
  (this->m_color).m_value = pCVar19->m_value;
  (this->m_stop_color).m_value = 0xff000000;
  this->m_opacity = 1.0;
  fVar23 = fill_opacity(parent);
  this->m_fill_opacity = fVar23;
  fVar23 = stroke_opacity(parent);
  this->m_stroke_opacity = fVar23;
  this->m_stop_opacity = 1.0;
  fVar23 = stroke_miterlimit(parent);
  this->m_stroke_miterlimit = fVar23;
  fVar23 = font_size(parent);
  this->m_font_size = fVar23;
  BaselineShift::BaselineShift(&this->m_baseline_shit);
  pLVar20 = stroke_width(parent);
  this->m_stroke_width = *pLVar20;
  pLVar20 = stroke_dashoffset(parent);
  this->m_stroke_dashoffset = *pLVar20;
  __x = stroke_dasharray(parent);
  std::vector<lunasvg::Length,_std::allocator<lunasvg::Length>_>::vector
            (&this->m_stroke_dasharray,__x);
  LVar1 = stroke_linecap(parent);
  this->m_stroke_linecap = LVar1;
  LVar2 = stroke_linejoin(parent);
  this->m_stroke_linejoin = LVar2;
  FVar3 = fill_rule(parent);
  this->m_fill_rule = FVar3;
  FVar3 = clip_rule(parent);
  this->m_clip_rule = FVar3;
  FVar4 = font_weight(parent);
  this->m_font_weight = FVar4;
  FVar5 = font_style(parent);
  this->m_font_style = FVar5;
  this->m_alignment_baseline = Auto;
  DVar6 = dominant_baseline(parent);
  this->m_dominant_baseline = DVar6;
  TVar7 = text_anchor(parent);
  this->m_text_anchor = TVar7;
  WVar8 = white_space(parent);
  this->m_white_space = WVar8;
  DVar9 = direction(parent);
  this->m_direction = DVar9;
  this->m_display = Inline;
  VVar10 = visibility(parent);
  this->m_visibility = VVar10;
  bVar11 = SVGNode::isRootElement(&element->super_SVGNode);
  this->m_overflow = ~bVar11 & Hidden;
  this->m_mask_type = Luminance;
  std::__cxx11::string::string((string *)&this->m_mask);
  std::__cxx11::string::string((string *)&this->m_clip_path);
  psVar21 = marker_start_abi_cxx11_(parent);
  std::__cxx11::string::string((string *)&this->m_marker_start,(string *)psVar21);
  psVar21 = marker_mid_abi_cxx11_(parent);
  std::__cxx11::string::string((string *)&this->m_marker_mid,(string *)psVar21);
  psVar21 = marker_end_abi_cxx11_(parent);
  std::__cxx11::string::string((string *)&this->m_marker_end,(string *)psVar21);
  psVar21 = font_family_abi_cxx11_(parent);
  std::__cxx11::string::string((string *)&this->m_font_family,(string *)psVar21);
  this_00 = SVGElement::attributes(element);
  __end1 = std::forward_list<lunasvg::Attribute,_std::allocator<lunasvg::Attribute>_>::begin
                     (this_00);
  attribute = (Attribute *)
              std::forward_list<lunasvg::Attribute,_std::allocator<lunasvg::Attribute>_>::end
                        (this_00);
  while (bVar11 = std::operator!=(&__end1,(_Self *)&attribute), bVar11) {
    input._M_str = (char *)std::_Fwd_list_const_iterator<lunasvg::Attribute>::operator*(&__end1);
    psVar21 = Attribute::value_abi_cxx11_((Attribute *)input._M_str);
    auVar24 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar21);
    input._M_len = auVar24._8_8_;
    auStack_60 = auVar24._0_8_;
    stripLeadingAndTrailingSpaces((string_view *)auStack_60);
    bVar11 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                       ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60);
    if ((!bVar11) &&
       (iVar17 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                           ((basic_string_view<char,_std::char_traits<char>_> *)auStack_60,"inherit"
                           ), iVar17 != 0)) {
      PVar12 = Attribute::id((Attribute *)input._M_str);
      switch(PVar12) {
      case Alignment_Baseline:
        AVar13 = parseAlignmentBaseline((string_view *)auStack_60);
        this->m_alignment_baseline = AVar13;
        break;
      case Baseline_Shift:
        BVar25 = parseBaselineShift((string_view *)auStack_60);
        local_198 = BVar25._0_8_;
        local_190 = CONCAT31(local_190._1_3_,BVar25.m_length.m_units);
        local_17c = local_190;
        (this->m_baseline_shit).m_type = (int)local_198;
        (this->m_baseline_shit).m_length.m_value = (float)(int)((ulong)local_198 >> 0x20);
        *(undefined4 *)&(this->m_baseline_shit).m_length.m_units = local_190;
        local_184 = local_198;
        break;
      default:
        break;
      case Clip_Path:
        local_248 = (lunasvg *)auStack_60;
        sStack_240 = input._M_len;
        input_12._M_str = (char *)&switchD_001308f0::switchdataD_0018c95c;
        input_12._M_len = input._M_len;
        parseUrl_abi_cxx11_(&local_238,(lunasvg *)auStack_60,input_12);
        std::__cxx11::string::operator=((string *)&this->m_clip_path,(string *)&local_238);
        std::__cxx11::string::~string((string *)&local_238);
        break;
      case Clip_Rule:
        FVar3 = parseFillRule((string_view *)auStack_60);
        this->m_clip_rule = FVar3;
        break;
      case Color:
        local_f8 = (lunasvg *)auStack_60;
        sStack_f0 = input._M_len;
        input_01._M_str = (char *)this;
        input_01._M_len = input._M_len;
        local_dc = (uint32_t)
                   parseColor((lunasvg *)auStack_60,input_01,(SVGLayoutState *)&Color::Black,in_R8);
        (this->m_color).m_value = local_dc;
        break;
      case Direction:
        DVar9 = parseDirection((string_view *)auStack_60);
        this->m_direction = DVar9;
        break;
      case Display:
        DVar14 = parseDisplay((string_view *)auStack_60);
        this->m_display = DVar14;
        break;
      case Dominant_Baseline:
        DVar6 = parseDominantBaseline((string_view *)auStack_60);
        this->m_dominant_baseline = DVar6;
        break;
      case Fill:
        local_98 = (lunasvg *)auStack_60;
        sStack_90 = input._M_len;
        in_R8 = (Color *)&Color::Black;
        input_09._M_str = (char *)this;
        input_09._M_len = input._M_len;
        parsePaint(&local_88,(lunasvg *)auStack_60,input_09,(SVGLayoutState *)&Color::Black,in_R9);
        Paint::operator=(&this->m_fill,&local_88);
        Paint::~Paint(&local_88);
        break;
      case Fill_Opacity:
        local_138 = (lunasvg *)auStack_60;
        sStack_130 = input._M_len;
        input_04._M_str = (char *)0x1;
        input_04._M_len = input._M_len;
        fVar23 = parseNumberOrPercentage((lunasvg *)auStack_60,input_04,true,1.0);
        this->m_fill_opacity = fVar23;
        break;
      case Fill_Rule:
        FVar3 = parseFillRule((string_view *)auStack_60);
        this->m_fill_rule = FVar3;
        break;
      case Font_Family:
        std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
                  ((string *)&this->m_font_family,
                   (basic_string_view<char,_std::char_traits<char>_> *)auStack_60);
        break;
      case Font_Size:
        local_178 = (lunasvg *)auStack_60;
        sStack_170 = input._M_len;
        input_08._M_str = (char *)this;
        input_08._M_len = input._M_len;
        fVar23 = parseFontSize((lunasvg *)auStack_60,input_08,
                               (SVGLayoutState *)&switchD_001308f0::switchdataD_0018c95c);
        this->m_font_size = fVar23;
        break;
      case Font_Style:
        FVar5 = parseFontStyle((string_view *)auStack_60);
        this->m_font_style = FVar5;
        break;
      case Font_Weight:
        FVar4 = parseFontWeight((string_view *)auStack_60);
        this->m_font_weight = FVar4;
        break;
      case Marker_End:
        input_15._M_str = (char *)&switchD_001308f0::switchdataD_0018c95c;
        input_15._M_len = input._M_len;
        parseUrl_abi_cxx11_(&local_2c8,(lunasvg *)auStack_60,input_15);
        std::__cxx11::string::operator=((string *)&this->m_marker_end,(string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
        break;
      case Marker_Mid:
        local_2a8 = (lunasvg *)auStack_60;
        sStack_2a0 = input._M_len;
        input_14._M_str = (char *)&switchD_001308f0::switchdataD_0018c95c;
        input_14._M_len = input._M_len;
        parseUrl_abi_cxx11_(&local_298,(lunasvg *)auStack_60,input_14);
        std::__cxx11::string::operator=((string *)&this->m_marker_mid,(string *)&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        break;
      case Marker_Start:
        local_278 = (lunasvg *)auStack_60;
        sStack_270 = input._M_len;
        input_13._M_str = (char *)&switchD_001308f0::switchdataD_0018c95c;
        input_13._M_len = input._M_len;
        parseUrl_abi_cxx11_(&local_268,(lunasvg *)auStack_60,input_13);
        std::__cxx11::string::operator=((string *)&this->m_marker_start,(string *)&local_268);
        std::__cxx11::string::~string((string *)&local_268);
        break;
      case Mask:
        local_218 = (lunasvg *)auStack_60;
        sStack_210 = input._M_len;
        input_11._M_str = (char *)&switchD_001308f0::switchdataD_0018c95c;
        input_11._M_len = input._M_len;
        parseUrl_abi_cxx11_(&local_208,(lunasvg *)auStack_60,input_11);
        std::__cxx11::string::operator=((string *)&this->m_mask,(string *)&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        break;
      case Mask_Type:
        MVar16 = parseMaskType((string_view *)auStack_60);
        this->m_mask_type = MVar16;
        break;
      case Opacity:
        local_128 = (lunasvg *)auStack_60;
        sStack_120 = input._M_len;
        input_03._M_str = (char *)0x1;
        input_03._M_len = input._M_len;
        fVar23 = parseNumberOrPercentage((lunasvg *)auStack_60,input_03,true,1.0);
        this->m_opacity = fVar23;
        break;
      case Overflow:
        OVar15 = parseOverflow((string_view *)auStack_60);
        this->m_overflow = OVar15;
        break;
      case Stop_Color:
        local_118 = (lunasvg *)auStack_60;
        sStack_110 = input._M_len;
        input_02._M_str = (char *)this;
        input_02._M_len = input._M_len;
        local_fc = (uint32_t)
                   parseColor((lunasvg *)auStack_60,input_02,(SVGLayoutState *)&Color::Black,in_R8);
        (this->m_stop_color).m_value = local_fc;
        break;
      case Stop_Opacity:
        local_158 = (lunasvg *)auStack_60;
        sStack_150 = input._M_len;
        input_06._M_str = (char *)0x1;
        input_06._M_len = input._M_len;
        fVar23 = parseNumberOrPercentage((lunasvg *)auStack_60,input_06,true,1.0);
        this->m_stop_opacity = fVar23;
        break;
      case Stroke:
        local_d8 = (lunasvg *)auStack_60;
        sStack_d0 = input._M_len;
        in_R8 = (Color *)&Color::Transparent;
        input_10._M_str = (char *)this;
        input_10._M_len = input._M_len;
        parsePaint(&local_c0,(lunasvg *)auStack_60,input_10,(SVGLayoutState *)&Color::Transparent,
                   in_R9);
        Paint::operator=(&this->m_stroke,&local_c0);
        Paint::~Paint(&local_c0);
        break;
      case Stroke_Dasharray:
        local_1e8 = (lunasvg *)auStack_60;
        sStack_1e0 = input._M_len;
        input_00._M_str = (char *)input._M_len;
        input_00._M_len = (size_t)auStack_60;
        parseDashArray(&local_1d0,input_00);
        std::vector<lunasvg::Length,_std::allocator<lunasvg::Length>_>::operator=
                  (&this->m_stroke_dasharray,&local_1d0);
        std::vector<lunasvg::Length,_std::allocator<lunasvg::Length>_>::~vector(&local_1d0);
        break;
      case Stroke_Dashoffset:
        Length::Length(&local_1b8,0.0,None);
        LVar22 = parseLength((string_view *)auStack_60,Allow,&local_1b8);
        local_1b0 = LVar22.m_value;
        local_1ac = LVar22.m_units;
        (this->m_stroke_dashoffset).m_value = local_1b0;
        (this->m_stroke_dashoffset).m_units = local_1ac;
        break;
      case Stroke_Linecap:
        LVar1 = parseLineCap((string_view *)auStack_60);
        this->m_stroke_linecap = LVar1;
        break;
      case Stroke_Linejoin:
        LVar2 = parseLineJoin((string_view *)auStack_60);
        this->m_stroke_linejoin = LVar2;
        break;
      case Stroke_Miterlimit:
        local_168 = (lunasvg *)auStack_60;
        sStack_160 = input._M_len;
        input_07._M_str = (char *)0x0;
        input_07._M_len = input._M_len;
        fVar23 = parseNumberOrPercentage((lunasvg *)auStack_60,input_07,true,4.0);
        this->m_stroke_miterlimit = fVar23;
        break;
      case Stroke_Opacity:
        local_148 = (lunasvg *)auStack_60;
        sStack_140 = input._M_len;
        input_05._M_str = (char *)0x1;
        input_05._M_len = input._M_len;
        fVar23 = parseNumberOrPercentage((lunasvg *)auStack_60,input_05,true,1.0);
        this->m_stroke_opacity = fVar23;
        break;
      case Stroke_Width:
        Length::Length(&local_1a8,1.0,None);
        LVar22 = parseLength((string_view *)auStack_60,Forbid,&local_1a8);
        local_1a0 = LVar22.m_value;
        local_19c = LVar22.m_units;
        (this->m_stroke_width).m_value = local_1a0;
        (this->m_stroke_width).m_units = local_19c;
        break;
      case Text_Anchor:
        TVar7 = parseTextAnchor((string_view *)auStack_60);
        this->m_text_anchor = TVar7;
        break;
      case Visibility:
        VVar10 = parseVisibility((string_view *)auStack_60);
        this->m_visibility = VVar10;
        break;
      case WhiteSpace:
        WVar8 = parseWhiteSpace((string_view *)auStack_60);
        this->m_white_space = WVar8;
      }
    }
    std::_Fwd_list_const_iterator<lunasvg::Attribute>::operator++(&__end1);
  }
  return;
}

Assistant:

SVGLayoutState::SVGLayoutState(const SVGLayoutState& parent, const SVGElement* element)
    : m_parent(&parent)
    , m_element(element)
    , m_fill(parent.fill())
    , m_stroke(parent.stroke())
    , m_color(parent.color())
    , m_fill_opacity(parent.fill_opacity())
    , m_stroke_opacity(parent.stroke_opacity())
    , m_stroke_miterlimit(parent.stroke_miterlimit())
    , m_font_size(parent.font_size())
    , m_stroke_width(parent.stroke_width())
    , m_stroke_dashoffset(parent.stroke_dashoffset())
    , m_stroke_dasharray(parent.stroke_dasharray())
    , m_stroke_linecap(parent.stroke_linecap())
    , m_stroke_linejoin(parent.stroke_linejoin())
    , m_fill_rule(parent.fill_rule())
    , m_clip_rule(parent.clip_rule())
    , m_font_weight(parent.font_weight())
    , m_font_style(parent.font_style())
    , m_dominant_baseline(parent.dominant_baseline())
    , m_text_anchor(parent.text_anchor())
    , m_white_space(parent.white_space())
    , m_direction(parent.direction())
    , m_visibility(parent.visibility())
    , m_overflow(element->isRootElement() ? Overflow::Visible : Overflow::Hidden)
    , m_marker_start(parent.marker_start())
    , m_marker_mid(parent.marker_mid())
    , m_marker_end(parent.marker_end())
    , m_font_family(parent.font_family())
{
    for(const auto& attribute : element->attributes()) {
        std::string_view input(attribute.value());
        stripLeadingAndTrailingSpaces(input);
        if(input.empty() || input.compare("inherit") == 0)
            continue;
        switch(attribute.id()) {
        case PropertyID::Fill:
            m_fill = parsePaint(input, this, Color::Black);
            break;
        case PropertyID::Stroke:
            m_stroke = parsePaint(input, this, Color::Transparent);
            break;
        case PropertyID::Color:
            m_color = parseColor(input, this, Color::Black);
            break;
        case PropertyID::Stop_Color:
            m_stop_color = parseColor(input, this, Color::Black);
            break;
        case PropertyID::Opacity:
            m_opacity = parseNumberOrPercentage(input, true, 1.f);
            break;
        case PropertyID::Fill_Opacity:
            m_fill_opacity = parseNumberOrPercentage(input, true, 1.f);
            break;
        case PropertyID::Stroke_Opacity:
            m_stroke_opacity = parseNumberOrPercentage(input, true, 1.f);
            break;
        case PropertyID::Stop_Opacity:
            m_stop_opacity = parseNumberOrPercentage(input, true, 1.f);
            break;
        case PropertyID::Stroke_Miterlimit:
            m_stroke_miterlimit = parseNumberOrPercentage(input, false, 4.f);
            break;
        case PropertyID::Font_Size:
            m_font_size = parseFontSize(input, this);
            break;
        case PropertyID::Baseline_Shift:
            m_baseline_shit = parseBaselineShift(input);
            break;
        case PropertyID::Stroke_Width:
            m_stroke_width = parseLength(input, LengthNegativeMode::Forbid, Length(1.f, LengthUnits::None));
            break;
        case PropertyID::Stroke_Dashoffset:
            m_stroke_dashoffset = parseLength(input, LengthNegativeMode::Allow, Length(0.f, LengthUnits::None));
            break;
        case PropertyID::Stroke_Dasharray:
            m_stroke_dasharray = parseDashArray(input);
            break;
        case PropertyID::Stroke_Linecap:
            m_stroke_linecap = parseLineCap(input);
            break;
        case PropertyID::Stroke_Linejoin:
            m_stroke_linejoin = parseLineJoin(input);
            break;
        case PropertyID::Fill_Rule:
            m_fill_rule = parseFillRule(input);
            break;
        case PropertyID::Clip_Rule:
            m_clip_rule = parseFillRule(input);
            break;
        case PropertyID::Font_Weight:
            m_font_weight = parseFontWeight(input);
            break;
        case PropertyID::Font_Style:
            m_font_style = parseFontStyle(input);
            break;
        case PropertyID::Alignment_Baseline:
            m_alignment_baseline = parseAlignmentBaseline(input);
            break;
        case PropertyID::Dominant_Baseline:
            m_dominant_baseline = parseDominantBaseline(input);
            break;
        case PropertyID::Direction:
            m_direction = parseDirection(input);
            break;
        case PropertyID::Text_Anchor:
            m_text_anchor = parseTextAnchor(input);
            break;
        case PropertyID::WhiteSpace:
            m_white_space = parseWhiteSpace(input);
            break;
        case PropertyID::Display:
            m_display = parseDisplay(input);
            break;
        case PropertyID::Visibility:
            m_visibility = parseVisibility(input);
            break;
        case PropertyID::Overflow:
            m_overflow = parseOverflow(input);
            break;
        case PropertyID::Mask_Type:
            m_mask_type = parseMaskType(input);
            break;
        case PropertyID::Mask:
            m_mask = parseUrl(input);
            break;
        case PropertyID::Clip_Path:
            m_clip_path = parseUrl(input);
            break;
        case PropertyID::Marker_Start:
            m_marker_start = parseUrl(input);
            break;
        case PropertyID::Marker_Mid:
            m_marker_mid = parseUrl(input);
            break;
        case PropertyID::Marker_End:
            m_marker_end = parseUrl(input);
            break;
        case PropertyID::Font_Family:
            m_font_family.assign(input);
            break;
        default:
            break;
        }
    }
}